

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

BOOL __thiscall
Js::LocalsWalker::CreateArgumentsObject(LocalsWalker *this,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  FunctionBody *pFVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RecyclableArgumentsObjectDisplay *this_00;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_01;
  RecyclableArgumentsObjectDisplay *this_02;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4a8,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) goto LAB_008b0d92;
    *puVar4 = 0;
  }
  if (pResolvedObject->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4a9,"(pResolvedObject->scriptContext)",
                                "pResolvedObject->scriptContext");
    if (!bVar2) goto LAB_008b0d92;
    *puVar4 = 0;
  }
  if (this->hasUserNotDefinedArguments == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4ab,"(hasUserNotDefinedArguments)","hasUserNotDefinedArguments");
    if (!bVar2) goto LAB_008b0d92;
    *puVar4 = 0;
  }
  pResolvedObject->name = L"arguments";
  pResolvedObject->propId = 0x1cf;
  pResolvedObject->typeId = TypeIds_Arguments;
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[2])();
  pFVar5 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (pFVar5 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x4b2,"(pFBody)","pFBody");
    if (!bVar2) goto LAB_008b0d92;
    *puVar4 = 0;
  }
  iVar3 = (*this->pFrame->_vptr_DiagStackFrame[8])();
  pResolvedObject->obj = (Var)CONCAT44(extraout_var_00,iVar3);
  if ((Var)CONCAT44(extraout_var_00,iVar3) == (Var)0x0) {
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[9])();
    pResolvedObject->obj = (Var)CONCAT44(extraout_var_01,iVar3);
    if ((Var)CONCAT44(extraout_var_01,iVar3) == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x4b8,"(pResolvedObject->obj)","pResolvedObject->obj");
      if (!bVar2) {
LAB_008b0d92:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    iVar3 = (*this->pFrame->_vptr_DiagStackFrame[0xe])();
    this_00 = (RecyclableArgumentsObjectDisplay *)
              new<Memory::ArenaAllocator>
                        (0x40,(ArenaAllocator *)CONCAT44(extraout_var_02,iVar3),0x364470);
    this_02 = this_00;
    RecyclableArgumentsObjectDisplay::RecyclableArgumentsObjectDisplay(this_00,pResolvedObject,this)
    ;
    pResolvedObject->objectDisplay = (IDiagObjectModelDisplay *)this_00;
    ExpandArgumentsObject((LocalsWalker *)this_02,(IDiagObjectModelDisplay *)this_00);
  }
  alloc = GetArenaFromContext(pResolvedObject->scriptContext);
  this_01 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x364470);
  RecyclableObjectAddress::RecyclableObjectAddress
            (this_01,(pResolvedObject->scriptContext->super_ScriptContextBase).globalObject,0x1cf,
             pResolvedObject->obj,0);
  pResolvedObject->address = (IDiagObjectAddress *)this_01;
  return 1;
}

Assistant:

BOOL LocalsWalker::CreateArgumentsObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);
        Assert(pResolvedObject->scriptContext);

        Assert(hasUserNotDefinedArguments);

        pResolvedObject->name = _u("arguments");
        pResolvedObject->propId = Js::PropertyIds::arguments;
        pResolvedObject->typeId = TypeIds_Arguments;

        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        pResolvedObject->obj = pFrame->GetArgumentsObject();
        if (pResolvedObject->obj == nullptr)
        {
            pResolvedObject->obj = pFrame->CreateHeapArguments();
            Assert(pResolvedObject->obj);

            pResolvedObject->objectDisplay = Anew(pFrame->GetArena(), RecyclableArgumentsObjectDisplay, pResolvedObject, this);
            ExpandArgumentsObject(pResolvedObject->objectDisplay);
        }

        pResolvedObject->address = Anew(GetArenaFromContext(pResolvedObject->scriptContext),
            RecyclableObjectAddress,
            pResolvedObject->scriptContext->GetGlobalObject(),
            Js::PropertyIds::arguments,
            pResolvedObject->obj,
            false /*isInDeadZone*/);

        return TRUE;
    }